

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O1

void ParseOptionMenuBody(FScanner *sc,FOptionMenuDescriptor *desc)

{
  bool bVar1;
  EColorRange EVar2;
  int iVar3;
  PClass *pPVar4;
  FOptionMenuItemControl *this;
  FOptionMenuItemOption *this_00;
  FOptionMenuFieldBase *this_01;
  FOptionMenuSliderCVar *this_02;
  FOptionMenuScreenResolutionLine *this_03;
  uint uVar5;
  PClass *pPVar6;
  FKeyBindings *bindings;
  FOptionMenuDescriptor *pFVar7;
  FString label;
  FString cvar;
  FString check;
  FString check_2;
  FString local_88;
  FString local_80;
  FOptionMenuItemStaticTextSwitchable *local_78;
  FString local_70;
  TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *local_68;
  double local_60;
  double local_58;
  FString local_50;
  FName local_44;
  double local_40;
  FString *local_38;
  
  FScanner::MustGetStringName(sc,"{");
  bVar1 = FScanner::CheckString(sc,"}");
  if (!bVar1) {
    local_68 = &(desc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>;
    local_38 = &desc->mTitle;
    do {
      FScanner::MustGetString(sc);
      bVar1 = FScanner::Compare(sc,"else");
      if (bVar1) {
        SkipSubBlock(sc);
        goto LAB_00336832;
      }
      bVar1 = FScanner::Compare(sc,"ifgame");
      if (bVar1) {
        bVar1 = CheckSkipGameBlock(sc);
LAB_003362f8:
        if (bVar1 == false) {
          ParseOptionMenuBody(sc,desc);
        }
      }
      else {
        bVar1 = FScanner::Compare(sc,"ifoption");
        if (bVar1) {
          bVar1 = CheckSkipOptionBlock(sc);
          goto LAB_003362f8;
        }
        bVar1 = FScanner::Compare(sc,"Class");
        if (bVar1) {
          FScanner::MustGetString(sc);
          local_88.Chars._0_4_ = FName::NameManager::FindName(&FName::NameData,sc->String,true);
          pPVar4 = PClass::FindClass((FName *)&local_88);
          if (pPVar4 == (PClass *)0x0) {
LAB_00336377:
            FScanner::ScriptError(sc,"Unknown menu class \'%s\'",sc->String);
          }
          else {
            pPVar6 = pPVar4;
            if (pPVar4 != DOptionMenu::RegistrationInfo.MyClass) {
              do {
                pPVar6 = pPVar6->ParentClass;
                if (pPVar6 == DOptionMenu::RegistrationInfo.MyClass) break;
              } while (pPVar6 != (PClass *)0x0);
              if (pPVar6 == (PClass *)0x0) goto LAB_00336377;
            }
          }
          (desc->super_FMenuDescriptor).mClass = pPVar4;
        }
        else {
          bVar1 = FScanner::Compare(sc,"Title");
          if (bVar1) {
            FScanner::MustGetString(sc);
            FString::operator=(local_38,sc->String);
          }
          else {
            bVar1 = FScanner::Compare(sc,"Position");
            if (bVar1) {
              FScanner::MustGetNumber(sc);
              desc->mPosition = sc->Number;
            }
            else {
              bVar1 = FScanner::Compare(sc,"DefaultSelection");
              if (bVar1) {
                FScanner::MustGetNumber(sc);
                desc->mSelectedItem = sc->Number;
              }
              else {
                bVar1 = FScanner::Compare(sc,"ScrollTop");
                if (bVar1) {
                  FScanner::MustGetNumber(sc);
                  desc->mScrollTop = sc->Number;
                }
                else {
                  bVar1 = FScanner::Compare(sc,"Indent");
                  if (bVar1) {
                    FScanner::MustGetNumber(sc);
                    desc->mIndent = sc->Number;
                  }
                  else {
                    bVar1 = FScanner::Compare(sc,"Submenu");
                    if (bVar1) {
                      FScanner::MustGetString(sc);
                      FString::FString(&local_88,sc->String);
                      FScanner::MustGetStringName(sc,",");
                      FScanner::MustGetString(sc);
                      this = (FOptionMenuItemControl *)operator_new(0x28);
                      local_78 = (FOptionMenuItemStaticTextSwitchable *)
                                 CONCAT44(local_88.Chars._4_4_,(int)local_88.Chars);
                      local_80.Chars._0_4_ =
                           FName::NameManager::FindName(&FName::NameData,sc->String,false);
                      FOptionMenuItem::FOptionMenuItem
                                ((FOptionMenuItem *)this,(char *)local_78,(FName *)&local_80,false);
                      (this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
                           (_func_int **)&PTR__FOptionMenuItem_0083d848;
                      *(undefined4 *)&(this->super_FOptionMenuItem).field_0x24 = 0;
                      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow(local_68,1);
LAB_00336819:
                      uVar5 = (desc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.
                              Count;
                      (desc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar5]
                           = &this->super_FOptionMenuItem;
                      (desc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count =
                           uVar5 + 1;
                    }
                    else {
                      bVar1 = FScanner::Compare(sc,"Option");
                      if (!bVar1) {
                        bVar1 = FScanner::Compare(sc,"Command");
                        if (bVar1) {
                          FScanner::MustGetString(sc);
                          FString::FString(&local_88,sc->String);
                          FScanner::MustGetStringName(sc,",");
                          FScanner::MustGetString(sc);
                          this = (FOptionMenuItemControl *)operator_new(0x28);
                          FOptionMenuItemCommand::FOptionMenuItemCommand
                                    ((FOptionMenuItemCommand *)this,
                                     (char *)CONCAT44(local_88.Chars._4_4_,(int)local_88.Chars),
                                     sc->String);
                          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow(local_68,1);
                        }
                        else {
                          bVar1 = FScanner::Compare(sc,"SafeCommand");
                          if (bVar1) {
                            FScanner::MustGetString(sc);
                            FString::FString(&local_88,sc->String);
                            FScanner::MustGetStringName(sc,",");
                            FScanner::MustGetString(sc);
                            FString::FString(&local_80,sc->String);
                            local_70.Chars = FString::NullString.Nothing;
                            FString::NullString.RefCount = FString::NullString.RefCount + 1;
                            bVar1 = FScanner::CheckString(sc,",");
                            if (bVar1) {
                              FScanner::MustGetString(sc);
                              FString::operator=(&local_70,sc->String);
                            }
                            this_01 = (FOptionMenuFieldBase *)operator_new(0x30);
                            FOptionMenuItemSafeCommand::FOptionMenuItemSafeCommand
                                      ((FOptionMenuItemSafeCommand *)this_01,
                                       (char *)CONCAT44(local_88.Chars._4_4_,(int)local_88.Chars),
                                       (char *)CONCAT44(local_80.Chars._4_4_,(int)local_80.Chars),
                                       local_70.Chars);
                            TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow(local_68,1);
                            goto LAB_0033674b;
                          }
                          bVar1 = FScanner::Compare(sc,"Control");
                          if ((bVar1) || (bVar1 = FScanner::Compare(sc,"MapControl"), bVar1)) {
                            bVar1 = FScanner::Compare(sc,"MapControl");
                            local_78 = (FOptionMenuItemStaticTextSwitchable *)
                                       CONCAT71(local_78._1_7_,bVar1);
                            FScanner::MustGetString(sc);
                            FString::FString(&local_88,sc->String);
                            FScanner::MustGetStringName(sc,",");
                            FScanner::MustGetString(sc);
                            this = (FOptionMenuItemControl *)operator_new(0x38);
                            bindings = &Bindings;
                            if ((char)local_78 != '\0') {
                              bindings = &AutomapBindings;
                            }
                            FOptionMenuItemControl::FOptionMenuItemControl
                                      (this,(char *)CONCAT44(local_88.Chars._4_4_,
                                                             (int)local_88.Chars),sc->String,
                                       bindings);
                            TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow(local_68,1);
                          }
                          else {
                            bVar1 = FScanner::Compare(sc,"ColorPicker");
                            if (bVar1) {
                              FScanner::MustGetString(sc);
                              FString::FString(&local_88,sc->String);
                              FScanner::MustGetStringName(sc,",");
                              FScanner::MustGetString(sc);
                              this = (FOptionMenuItemControl *)operator_new(0x30);
                              FOptionMenuItemColorPicker::FOptionMenuItemColorPicker
                                        ((FOptionMenuItemColorPicker *)this,
                                         (char *)CONCAT44(local_88.Chars._4_4_,(int)local_88.Chars),
                                         sc->String);
                              TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow(local_68,1);
                            }
                            else {
                              bVar1 = FScanner::Compare(sc,"StaticText");
                              if (!bVar1) {
                                bVar1 = FScanner::Compare(sc,"StaticTextSwitchable");
                                if (bVar1) {
                                  FScanner::MustGetString(sc);
                                  FString::FString(&local_88,sc->String);
                                  FScanner::MustGetStringName(sc,",");
                                  FScanner::MustGetString(sc);
                                  FString::FString(&local_80,sc->String);
                                  FScanner::MustGetStringName(sc,",");
                                  FScanner::MustGetString(sc);
                                  pFVar7 = (FOptionMenuDescriptor *)sc->String;
                                  iVar3 = FName::NameManager::FindName
                                                    (&FName::NameData,(char *)pFVar7,false);
                                  local_60 = (double)CONCAT44(local_60._4_4_,iVar3);
                                  EVar2 = ParseOptionColor(sc,pFVar7);
                                  local_78 = (FOptionMenuItemStaticTextSwitchable *)
                                             operator_new(0x38);
                                  local_44.Index = (int)local_60._0_4_;
                                  FOptionMenuItemStaticTextSwitchable::
                                  FOptionMenuItemStaticTextSwitchable
                                            (local_78,(char *)CONCAT44(local_88.Chars._4_4_,
                                                                       (int)local_88.Chars),
                                             (char *)CONCAT44(local_80.Chars._4_4_,
                                                              (int)local_80.Chars),&local_44,EVar2);
                                  TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow(local_68,1);
                                  uVar5 = (desc->mItems).
                                          super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
                                  (desc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.
                                  Array[uVar5] = &local_78->super_FOptionMenuItem;
                                }
                                else {
                                  bVar1 = FScanner::Compare(sc,"Slider");
                                  if (!bVar1) {
                                    bVar1 = FScanner::Compare(sc,"screenresolution");
                                    if (bVar1) {
                                      FScanner::MustGetString(sc);
                                      this_03 = (FOptionMenuScreenResolutionLine *)
                                                operator_new(0x50);
                                      FOptionMenuScreenResolutionLine::
                                      FOptionMenuScreenResolutionLine(this_03,sc->String);
                                      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow(local_68,1)
                                      ;
                                      uVar5 = (desc->mItems).
                                              super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.
                                              Count;
                                      (desc->mItems).
                                      super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array
                                      [uVar5] = (FOptionMenuItem *)this_03;
                                      (desc->mItems).
                                      super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count =
                                           uVar5 + 1;
                                      goto LAB_00336832;
                                    }
                                    bVar1 = FScanner::Compare(sc,"TextField");
                                    if (bVar1) {
                                      FScanner::MustGetString(sc);
                                      FString::FString(&local_88,sc->String);
                                      FScanner::MustGetStringName(sc,",");
                                      FScanner::MustGetString(sc);
                                      FString::FString(&local_80,sc->String);
                                      local_70.Chars = FString::NullString.Nothing;
                                      FString::NullString.RefCount =
                                           FString::NullString.RefCount + 1;
                                      bVar1 = FScanner::CheckString(sc,",");
                                      if (bVar1) {
                                        FScanner::MustGetString(sc);
                                        FString::operator=(&local_70,sc->String);
                                      }
                                      this_01 = (FOptionMenuFieldBase *)operator_new(0xc0);
                                      FOptionMenuFieldBase::FOptionMenuFieldBase
                                                (this_01,(char *)CONCAT44(local_88.Chars._4_4_,
                                                                          (int)local_88.Chars),
                                                 (char *)CONCAT44(local_80.Chars._4_4_,
                                                                  (int)local_80.Chars),
                                                 local_70.Chars);
                                      (this_01->super_FOptionMenuItem).super_FListMenuItem.
                                      _vptr_FListMenuItem =
                                           (_func_int **)&PTR__FOptionMenuItem_0083ed30;
                                      *(undefined1 *)
                                       &this_01[1].super_FOptionMenuItem.super_FListMenuItem.
                                        _vptr_FListMenuItem = 0;
                                      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow(local_68,1)
                                      ;
                                    }
                                    else {
                                      bVar1 = FScanner::Compare(sc,"NumberField");
                                      if (!bVar1) {
                                        FScanner::ScriptError
                                                  (sc,"Unknown keyword \'%s\'",sc->String);
                                        goto LAB_00336832;
                                      }
                                      FScanner::MustGetString(sc);
                                      FString::FString(&local_88,sc->String);
                                      FScanner::MustGetStringName(sc,",");
                                      FScanner::MustGetString(sc);
                                      FString::FString(&local_80,sc->String);
                                      local_70.Chars = FString::NullString.Nothing;
                                      FString::NullString.RefCount =
                                           FString::NullString.RefCount + 1;
                                      bVar1 = FScanner::CheckString(sc,",");
                                      local_60 = (double)((ulong)local_60 & 0xffffffff00000000);
                                      local_58 = (double)CONCAT44(local_58._4_4_,0x42c80000);
                                      local_78 = (FOptionMenuItemStaticTextSwitchable *)
                                                 CONCAT44(local_78._4_4_,0x3f800000);
                                      if (bVar1) {
                                        FScanner::MustGetFloat(sc);
                                        local_60 = (double)CONCAT44(local_60._4_4_,(float)sc->Float)
                                        ;
                                        FScanner::MustGetStringName(sc,",");
                                        FScanner::MustGetFloat(sc);
                                        local_58 = (double)CONCAT44(local_58._4_4_,(float)sc->Float)
                                        ;
                                        bVar1 = FScanner::CheckString(sc,",");
                                        if (bVar1) {
                                          FScanner::MustGetFloat(sc);
                                          local_78 = (FOptionMenuItemStaticTextSwitchable *)
                                                     CONCAT44(local_78._4_4_,(float)sc->Float);
                                          bVar1 = FScanner::CheckString(sc,",");
                                          if (bVar1) {
                                            FScanner::MustGetString(sc);
                                            FString::operator=(&local_70,sc->String);
                                          }
                                        }
                                        else {
                                          local_78 = (FOptionMenuItemStaticTextSwitchable *)
                                                     CONCAT44(local_78._4_4_,0x3f800000);
                                        }
                                      }
                                      this_01 = (FOptionMenuFieldBase *)operator_new(0x48);
                                      FOptionMenuFieldBase::FOptionMenuFieldBase
                                                (this_01,(char *)CONCAT44(local_88.Chars._4_4_,
                                                                          (int)local_88.Chars),
                                                 (char *)CONCAT44(local_80.Chars._4_4_,
                                                                  (int)local_80.Chars),
                                                 local_70.Chars);
                                      (this_01->super_FOptionMenuItem).super_FListMenuItem.
                                      _vptr_FListMenuItem =
                                           (_func_int **)&PTR__FOptionMenuItem_0083eec0;
                                      *(float *)&this_01[1].super_FOptionMenuItem.
                                                 super_FListMenuItem._vptr_FListMenuItem =
                                           local_60._0_4_;
                                      *(float *)((long)&this_01[1].super_FOptionMenuItem.
                                                        super_FListMenuItem._vptr_FListMenuItem + 4)
                                           = local_58._0_4_;
                                      this_01[1].super_FOptionMenuItem.super_FListMenuItem.mXpos =
                                           (int)local_78._0_4_;
                                      if (local_58._0_4_ <= local_60._0_4_) {
                                        *(float *)&this_01[1].super_FOptionMenuItem.
                                                   super_FListMenuItem._vptr_FListMenuItem =
                                             local_58._0_4_;
                                        *(float *)((long)&this_01[1].super_FOptionMenuItem.
                                                          super_FListMenuItem._vptr_FListMenuItem +
                                                  4) = local_60._0_4_;
                                      }
                                      if (local_78._0_4_ <= 0.0) {
                                        this_01[1].super_FOptionMenuItem.super_FListMenuItem.mXpos =
                                             0x3f800000;
                                      }
                                      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow(local_68,1)
                                      ;
                                    }
LAB_0033674b:
                                    uVar5 = (desc->mItems).
                                            super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count
                                    ;
                                    (desc->mItems).
                                    super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar5]
                                         = &this_01->super_FOptionMenuItem;
                                    (desc->mItems).
                                    super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count =
                                         uVar5 + 1;
                                    goto LAB_0033675c;
                                  }
                                  FScanner::MustGetString(sc);
                                  FString::FString(&local_88,sc->String);
                                  FScanner::MustGetStringName(sc,",");
                                  FScanner::MustGetString(sc);
                                  FString::FString(&local_80,sc->String);
                                  FScanner::MustGetStringName(sc,",");
                                  FScanner::MustGetFloat(sc);
                                  local_60 = sc->Float;
                                  FScanner::MustGetStringName(sc,",");
                                  FScanner::MustGetFloat(sc);
                                  local_58 = sc->Float;
                                  FScanner::MustGetStringName(sc,",");
                                  FScanner::MustGetFloat(sc);
                                  local_40 = sc->Float;
                                  bVar1 = FScanner::CheckString(sc,",");
                                  local_78 = (FOptionMenuItemStaticTextSwitchable *)
                                             CONCAT44(local_78._4_4_,1);
                                  if (bVar1) {
                                    FScanner::MustGetNumber(sc);
                                    local_78 = (FOptionMenuItemStaticTextSwitchable *)
                                               CONCAT44(local_78._4_4_,sc->Number);
                                  }
                                  this_02 = (FOptionMenuSliderCVar *)operator_new(0x58);
                                  FOptionMenuSliderCVar::FOptionMenuSliderCVar
                                            (this_02,(char *)CONCAT44(local_88.Chars._4_4_,
                                                                      (int)local_88.Chars),
                                             (char *)CONCAT44(local_80.Chars._4_4_,
                                                              (int)local_80.Chars),local_60,local_58
                                             ,local_40,(int)local_78._0_4_);
                                  TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow(local_68,1);
                                  uVar5 = (desc->mItems).
                                          super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
                                  (desc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.
                                  Array[uVar5] = (FOptionMenuItem *)this_02;
                                }
                                (desc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.
                                Count = uVar5 + 1;
                                goto LAB_00336766;
                              }
                              FScanner::MustGetString(sc);
                              pFVar7 = (FOptionMenuDescriptor *)sc->String;
                              FString::FString(&local_88,(char *)pFVar7);
                              EVar2 = ParseOptionColor(sc,pFVar7);
                              local_78 = (FOptionMenuItemStaticTextSwitchable *)
                                         CONCAT44(local_78._4_4_,EVar2);
                              this = (FOptionMenuItemControl *)operator_new(0x28);
                              local_80.Chars._0_4_ = 0;
                              FOptionMenuItem::FOptionMenuItem
                                        ((FOptionMenuItem *)this,
                                         (char *)CONCAT44(local_88.Chars._4_4_,(int)local_88.Chars),
                                         (FName *)&local_80,true);
                              (this->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem
                                   = (_func_int **)&PTR__FOptionMenuItem_0083d510;
                              *(float *)&(this->super_FOptionMenuItem).field_0x24 = local_78._0_4_;
                              TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow(local_68,1);
                            }
                          }
                        }
                        goto LAB_00336819;
                      }
                      FScanner::MustGetString(sc);
                      FString::FString(&local_88,sc->String);
                      FScanner::MustGetStringName(sc,",");
                      FScanner::MustGetString(sc);
                      FString::FString(&local_80,sc->String);
                      FScanner::MustGetStringName(sc,",");
                      FScanner::MustGetString(sc);
                      FString::FString(&local_70,sc->String);
                      local_50.Chars = FString::NullString.Nothing;
                      FString::NullString.RefCount = FString::NullString.RefCount + 1;
                      bVar1 = FScanner::CheckString(sc,",");
                      local_78 = (FOptionMenuItemStaticTextSwitchable *)
                                 ((ulong)local_78 & 0xffffffff00000000);
                      if (bVar1) {
                        FScanner::MustGetString(sc);
                        if (*sc->String != '\0') {
                          FString::operator=(&local_50,sc->String);
                        }
                        bVar1 = FScanner::CheckString(sc,",");
                        if (bVar1) {
                          FScanner::MustGetNumber(sc);
                          local_78 = (FOptionMenuItemStaticTextSwitchable *)
                                     CONCAT44(local_78._4_4_,sc->Number);
                        }
                      }
                      this_00 = (FOptionMenuItemOption *)operator_new(0x40);
                      FOptionMenuItemOption::FOptionMenuItemOption
                                (this_00,(char *)CONCAT44(local_88.Chars._4_4_,(int)local_88.Chars),
                                 (char *)CONCAT44(local_80.Chars._4_4_,(int)local_80.Chars),
                                 local_70.Chars,local_50.Chars,(int)local_78._0_4_);
                      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow(local_68,1);
                      uVar5 = (desc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.
                              Count;
                      (desc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar5]
                           = (FOptionMenuItem *)this_00;
                      (desc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count =
                           uVar5 + 1;
                      FString::~FString(&local_50);
LAB_0033675c:
                      FString::~FString(&local_70);
LAB_00336766:
                      FString::~FString(&local_80);
                    }
                    FString::~FString(&local_88);
                  }
                }
              }
            }
          }
        }
      }
LAB_00336832:
      bVar1 = FScanner::CheckString(sc,"}");
    } while (!bVar1);
  }
  return;
}

Assistant:

static void ParseOptionMenuBody(FScanner &sc, FOptionMenuDescriptor *desc)
{
	sc.MustGetStringName("{");
	while (!sc.CheckString("}"))
	{
		sc.MustGetString();
		if (sc.Compare("else"))
		{
			SkipSubBlock(sc);
		}
		else if (sc.Compare("ifgame"))
		{
			if (!CheckSkipGameBlock(sc))
			{
				// recursively parse sub-block
				ParseOptionMenuBody(sc, desc);
			}
		}
		else if (sc.Compare("ifoption"))
		{
			if (!CheckSkipOptionBlock(sc))
			{
				// recursively parse sub-block
				ParseOptionMenuBody(sc, desc);
			}
		}
		else if (sc.Compare("Class"))
		{
			sc.MustGetString();
			const PClass *cls = PClass::FindClass(sc.String);
			if (cls == NULL || !cls->IsDescendantOf(RUNTIME_CLASS(DOptionMenu)))
			{
				sc.ScriptError("Unknown menu class '%s'", sc.String);
			}
			desc->mClass = cls;
		}
		else if (sc.Compare("Title"))
		{
			sc.MustGetString();
			desc->mTitle = sc.String;
		}
		else if (sc.Compare("Position"))
		{
			sc.MustGetNumber();
			desc->mPosition = sc.Number;
		}
		else if (sc.Compare("DefaultSelection"))
		{
			sc.MustGetNumber();
			desc->mSelectedItem = sc.Number;
		}
		else if (sc.Compare("ScrollTop"))
		{
			sc.MustGetNumber();
			desc->mScrollTop = sc.Number;
		}
		else if (sc.Compare("Indent"))
		{
			sc.MustGetNumber();
			desc->mIndent = sc.Number;
		}
		else if (sc.Compare("Submenu"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FOptionMenuItem *it = new FOptionMenuItemSubmenu(label, sc.String);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("Option"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FString cvar = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FString values = sc.String;
			FString check;
			int center = 0;
			if (sc.CheckString(","))
			{
				sc.MustGetString();
				if (*sc.String != 0) check = sc.String;
				if (sc.CheckString(","))
				{
					sc.MustGetNumber();
					center = sc.Number;
				}
			}
			FOptionMenuItem *it = new FOptionMenuItemOption(label, cvar, values, check, center);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("Command"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FOptionMenuItem *it = new FOptionMenuItemCommand(label, sc.String);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("SafeCommand"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FString command = sc.String;
			FString prompt;
			// Check for optional custom prompt
			if (sc.CheckString(","))
			{
				sc.MustGetString();
				prompt = sc.String;
			}
			FOptionMenuItem *it = new FOptionMenuItemSafeCommand(label, command, prompt);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("Control") || sc.Compare("MapControl"))
		{
			bool map = sc.Compare("MapControl");
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FOptionMenuItem *it = new FOptionMenuItemControl(label, sc.String, map? &AutomapBindings : &Bindings);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("ColorPicker"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FOptionMenuItem *it = new FOptionMenuItemColorPicker(label, sc.String);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("StaticText"))
		{
			sc.MustGetString();
			FString label = sc.String;
			EColorRange cr = ParseOptionColor(sc, desc);
			FOptionMenuItem *it = new FOptionMenuItemStaticText(label, cr);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("StaticTextSwitchable"))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FString label2 = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FName action = sc.String;
			EColorRange cr = ParseOptionColor(sc, desc);
			FOptionMenuItem *it = new FOptionMenuItemStaticTextSwitchable(label, label2, action, cr);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("Slider"))
		{
			sc.MustGetString();
			FString text = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetString();
			FString action = sc.String;
			sc.MustGetStringName(",");
			sc.MustGetFloat();
			double min = sc.Float;
			sc.MustGetStringName(",");
			sc.MustGetFloat();
			double max = sc.Float;
			sc.MustGetStringName(",");
			sc.MustGetFloat();
			double step = sc.Float;
			int showvalue = 1;
			if (sc.CheckString(","))
			{
				sc.MustGetNumber();
				showvalue = sc.Number;
			}
			FOptionMenuItem *it = new FOptionMenuSliderCVar(text, action, min, max, step, showvalue);
			desc->mItems.Push(it);
		}
		else if (sc.Compare("screenresolution"))
		{
			sc.MustGetString();
			FOptionMenuItem *it = new FOptionMenuScreenResolutionLine(sc.String);
			desc->mItems.Push(it);
		}
		// [TP] -- Text input widget
		else if ( sc.Compare( "TextField" ))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName( "," );
			sc.MustGetString();
			FString cvar = sc.String;
			FString check;
			
			if ( sc.CheckString( "," ))
			{
				sc.MustGetString();
				check = sc.String;
			}

			FOptionMenuItem* it = new FOptionMenuTextField( label, cvar, check );
			desc->mItems.Push( it );
		}
		// [TP] -- Number input widget
		else if ( sc.Compare( "NumberField" ))
		{
			sc.MustGetString();
			FString label = sc.String;
			sc.MustGetStringName( "," );
			sc.MustGetString();
			FString cvar = sc.String;
			float minimum = 0.0f;
			float maximum = 100.0f;
			float step = 1.0f;
			FString check;

			if ( sc.CheckString( "," ))
			{
				sc.MustGetFloat();
				minimum = (float) sc.Float;
				sc.MustGetStringName( "," );
				sc.MustGetFloat();
				maximum = (float) sc.Float;

				if ( sc.CheckString( "," ))
				{
					sc.MustGetFloat();
					step = (float) sc.Float;

					if ( sc.CheckString( "," ))
					{
						sc.MustGetString();
						check = sc.String;
					}
				}
			}

			FOptionMenuItem* it = new FOptionMenuNumberField( label, cvar,
				minimum, maximum, step, check );
			desc->mItems.Push( it );
		}
		else
		{
			sc.ScriptError("Unknown keyword '%s'", sc.String);
		}
	}
}